

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# residue.cpp
# Opt level: O1

void Residue::InitPar(char *parFile,string *dir)

{
  vector<int,std::allocator<int>> *this;
  undefined1 *puVar1;
  byte bVar2;
  pointer pcVar3;
  char *pcVar4;
  char *pcVar5;
  iterator __position;
  pointer pbVar6;
  size_type sVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  iterator iVar12;
  long lVar13;
  iterator iVar14;
  ostream *poVar15;
  size_t sVar16;
  _Rb_tree_color _Var17;
  long lVar18;
  double *pdVar19;
  long lVar20;
  pointer pbVar21;
  pointer pbVar22;
  string *psVar23;
  ulong uVar24;
  double dVar25;
  undefined1 auVar26 [16];
  int tmpInt;
  int numLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strVec;
  string tmpStr;
  char tempCh [200];
  ifstream inFile;
  char tmpLine [500];
  _Rb_tree_color local_578;
  int local_574;
  double *local_570;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_568;
  string *local_550;
  string local_548;
  int local_524;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_520;
  char local_4f8;
  char cStack_4f7;
  char cStack_4f6;
  char cStack_4f5;
  char cStack_4f4;
  char cStack_4f3;
  char cStack_4f2;
  char cStack_4f1;
  char cStack_4f0;
  char cStack_4ef;
  char cStack_4ee;
  char cStack_4ed;
  char cStack_4ec;
  char cStack_4eb;
  char cStack_4ea;
  char cStack_4e9;
  long local_430 [4];
  byte abStack_410 [488];
  char local_228 [504];
  
  std::ifstream::ifstream(local_430);
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  local_548._M_string_length = 0;
  local_548.field_2._M_local_buf[0] = '\0';
  local_568.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_568.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::open((char *)local_430,(_Ios_Openmode)parFile);
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    strcpy(&local_4f8,(dir->_M_dataplus)._M_p);
    strcat(&local_4f8,parFile);
    std::ifstream::open((char *)local_430,(_Ios_Openmode)&local_4f8);
    cVar8 = std::__basic_file<char>::is_open();
    if (cVar8 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"cannot open parameter file ",0x1b);
      sVar16 = strlen(&local_4f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_4f8,sVar16);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_00133d3d:
      exit(0);
    }
  }
  std::ios::clear((int)local_430 + (int)*(undefined8 *)(local_430[0] + -0x18));
  std::istream::seekg((long)local_430,_S_beg);
  lVar18 = *(long *)(local_430[0] + -0x18);
  bVar2 = abStack_410[lVar18];
  do {
    if ((bVar2 & 2) != 0) {
      bb_size = 1.93;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_568);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p);
      }
      std::ifstream::~ifstream(local_430);
      return;
    }
    std::ios::widen((char)&local_578 + (char)lVar18 + 'H');
    std::istream::getline((char *)local_430,(long)local_228,-0x18);
    __isoc99_sscanf(local_228,"%*s %s %d",&local_4f8,&local_574);
    if (CONCAT17(cStack_4f1,
                 CONCAT16(cStack_4f2,
                          CONCAT15(cStack_4f3,
                                   CONCAT14(cStack_4f4,
                                            CONCAT13(cStack_4f5,
                                                     CONCAT12(cStack_4f6,
                                                              CONCAT11(cStack_4f7,local_4f8)))))))
        == 0x65707974736572) {
      if (0 < local_574) {
        lVar18 = 0;
        local_550 = (string *)cType_abi_cxx11_;
        local_570 = (double *)vdwType;
        local_524 = 0;
        do {
          std::ios::widen((char)*(undefined8 *)(local_430[0] + -0x18) + (char)local_430);
          std::istream::getline((char *)local_430,(long)local_228,-0x18);
          sVar7 = local_548._M_string_length;
          strlen(local_228);
          std::__cxx11::string::_M_replace((ulong)&local_548,0,(char *)sVar7,(ulong)local_228);
          pbVar6 = local_568.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar22 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar21 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              pcVar3 = (pbVar21->_M_dataplus)._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != &pbVar21->field_2) {
                operator_delete(pcVar3);
              }
              pbVar21 = pbVar21 + 1;
            } while (pbVar21 != pbVar6);
            local_568.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar22;
          }
          iVar9 = split(&local_548,' ',&local_568);
          numAtom[lVar18] = (iVar9 - (iVar9 + -2 >> 0x1f)) + -2 >> 1;
          pcVar4 = ((local_568.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          pcVar5 = (char *)Name1_abi_cxx11_[lVar18]._M_string_length;
          strlen(pcVar4);
          std::__cxx11::string::_M_replace
                    ((ulong)(Name1_abi_cxx11_ + lVar18),0,pcVar5,(ulong)pcVar4);
          std::__cxx11::string::_M_assign((string *)&local_548);
          iVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&AAMap_abi_cxx11_._M_t,&local_548);
          if ((_Rb_tree_header *)iVar12._M_node ==
              &AAMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"file reading error, wrong AA type ",0x22);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_548._M_dataplus._M_p,
                                 local_548._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar15);
            goto LAB_00133d3d;
          }
          std::__cxx11::string::_M_assign((string *)(Name3_abi_cxx11_ + lVar18));
          iVar9 = local_524;
          local_578 = 2;
          if (0 < numAtom[lVar18]) {
            lVar20 = 0;
            psVar23 = local_550;
            do {
              local_578 = local_578 + _S_black;
              std::__cxx11::string::_M_assign(psVar23);
              lVar13 = (long)(int)local_578;
              local_578 = local_578 + _S_black;
              iVar10 = atoi(local_568.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar13]._M_dataplus._M_p);
              *(int *)((long)local_570 + lVar20 * 4) = iVar10;
              std::__cxx11::string::_M_assign((string *)&local_548);
              std::__cxx11::string::_M_append((char *)&local_548,*(ulong *)psVar23);
              local_520.first._M_dataplus._M_p = (pointer)&local_520.first.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_520,local_548._M_dataplus._M_p,
                         (char *)(local_548._M_string_length + (long)local_548._M_dataplus._M_p));
              local_520.second = (int)lVar20;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                          *)&AtomMap_abi_cxx11_,&local_520);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_520.first._M_dataplus._M_p != &local_520.first.field_2) {
                operator_delete(local_520.first._M_dataplus._M_p);
              }
              local_520.first._M_dataplus._M_p = (pointer)&local_520.first.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_520,local_548._M_dataplus._M_p,
                         (char *)(local_548._M_string_length + (long)local_548._M_dataplus._M_p));
              local_520.second = iVar9 + (int)lVar20;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                          *)&AtomIndexMap_abi_cxx11_,&local_520);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_520.first._M_dataplus._M_p != &local_520.first.field_2) {
                operator_delete(local_520.first._M_dataplus._M_p);
              }
              lVar20 = lVar20 + 1;
              psVar23 = psVar23 + 0x20;
            } while (lVar20 < numAtom[lVar18]);
            local_524 = local_524 + (int)lVar20;
          }
          lVar18 = lVar18 + 1;
          local_570 = local_570 + 0xf;
          local_550 = local_550 + 0x3c0;
        } while (lVar18 < local_574);
      }
    }
    else if (CONCAT17(cStack_4ea,
                      CONCAT16(cStack_4eb,
                               CONCAT15(cStack_4ec,
                                        CONCAT14(cStack_4ed,
                                                 CONCAT13(cStack_4ee,
                                                          CONCAT12(cStack_4ef,
                                                                   CONCAT11(cStack_4f0,cStack_4f1)))
                                                )))) == 0x79636e65646e65 &&
             CONCAT17(cStack_4f1,
                      CONCAT16(cStack_4f2,
                               CONCAT15(cStack_4f3,
                                        CONCAT14(cStack_4f4,
                                                 CONCAT13(cStack_4f5,
                                                          CONCAT12(cStack_4f6,
                                                                   CONCAT11(cStack_4f7,local_4f8))))
                                       ))) == 0x657065446d6f7461) {
      if (0 < local_574) {
        lVar18 = 0x19b068;
        local_550 = (string *)(prev_atom[0][0] + 2);
        pdVar19 = (double *)0x0;
        do {
          std::ios::widen((char)*(undefined8 *)(local_430[0] + -0x18) + (char)local_430);
          std::istream::getline((char *)local_430,(long)local_228,-0x18);
          sVar7 = local_548._M_string_length;
          strlen(local_228);
          std::__cxx11::string::_M_replace((ulong)&local_548,0,(char *)sVar7,(ulong)local_228);
          pbVar6 = local_568.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar22 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar21 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              pcVar3 = (pbVar21->_M_dataplus)._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != &pbVar21->field_2) {
                operator_delete(pcVar3);
              }
              pbVar21 = pbVar21 + 1;
            } while (pbVar21 != pbVar6);
            local_568.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar22;
          }
          split(&local_548,' ',&local_568);
          pbVar22 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          sVar16 = local_568.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
          if ((sVar16 != Name1_abi_cxx11_[(long)pdVar19]._M_string_length) ||
             ((sVar16 != 0 &&
              (iVar9 = bcmp(local_568.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                            Name1_abi_cxx11_[(long)pdVar19]._M_dataplus._M_p,sVar16), iVar9 != 0))))
          {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"atomDependency error, wrong AA type ",0x24);
            poVar15 = (ostream *)std::ostream::operator<<(&std::cout,(int)pdVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
            local_520.first._M_dataplus._M_p._0_1_ =
                 *local_568.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,(char *)&local_520,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,Name1_abi_cxx11_[(long)pdVar19]._M_dataplus._M_p,
                                 Name1_abi_cxx11_[(long)pdVar19]._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar15);
            goto LAB_00133d3d;
          }
          local_578 = 2;
          iVar9 = numAtom[(long)pdVar19];
          local_570 = pdVar19;
          if (0 < (long)iVar9) {
            pbVar22 = pbVar22 + 2;
            lVar20 = 0;
            psVar23 = local_550;
            do {
              iVar10 = (int)lVar20;
              local_578 = iVar10 + 3;
              sVar16 = pbVar22->_M_string_length;
              if ((sVar16 != *(size_t *)(lVar18 + lVar20 * 8)) ||
                 ((sVar16 != 0 &&
                  (iVar11 = bcmp((pbVar22->_M_dataplus)._M_p,*(void **)(lVar18 + -8 + lVar20 * 8),
                                 sVar16), iVar11 != 0)))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"atomDependency error, wrong atom type ",0x26);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     local_568.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(int)local_578].
                                     _M_dataplus._M_p,
                                     local_568.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(int)local_578].
                                     _M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,*(char **)(lVar18 + -8 + lVar20 * 8),
                                     *(long *)(lVar18 + lVar20 * 8));
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)local_570);
                std::endl<char,std::char_traits<char>>(poVar15);
                goto LAB_00133d3d;
              }
              lVar20 = lVar20 + 4;
              local_578 = (_Rb_tree_color)lVar20;
              iVar11 = atoi(pbVar22[1]._M_dataplus._M_p);
              *(int *)(psVar23 + -8) = iVar11;
              local_578 = iVar10 + 5;
              iVar11 = atoi(pbVar22[2]._M_dataplus._M_p);
              *(int *)(psVar23 + -4) = iVar11;
              local_578 = iVar10 + 6;
              iVar10 = atoi(pbVar22[3]._M_dataplus._M_p);
              *(int *)psVar23 = iVar10;
              pbVar22 = pbVar22 + 4;
              psVar23 = psVar23 + 0xc;
            } while ((long)iVar9 * 4 != lVar20);
          }
          pdVar19 = (double *)((long)local_570 + 1);
          local_550 = local_550 + 0x168;
          lVar18 = lVar18 + 0x3c0;
        } while ((long)pdVar19 < (long)local_574);
      }
    }
    else if (CONCAT17(cStack_4eb,
                      CONCAT16(cStack_4ec,
                               CONCAT15(cStack_4ed,
                                        CONCAT14(cStack_4ee,
                                                 CONCAT13(cStack_4ef,
                                                          CONCAT12(cStack_4f0,
                                                                   CONCAT11(cStack_4f1,cStack_4f2)))
                                                )))) == 0x726574656d6172 &&
             CONCAT17(cStack_4f1,
                      CONCAT16(cStack_4f2,
                               CONCAT15(cStack_4f3,
                                        CONCAT14(cStack_4f4,
                                                 CONCAT13(cStack_4f5,
                                                          CONCAT12(cStack_4f6,
                                                                   CONCAT11(cStack_4f7,local_4f8))))
                                       ))) == 0x61726150646e6f62) {
      if (0 < local_574) {
        lVar18 = 0x19b068;
        local_570 = (double *)0x0;
        psVar23 = (string *)0x0;
        do {
          std::ios::widen((char)*(undefined8 *)(local_430[0] + -0x18) + (char)local_430);
          std::istream::getline((char *)local_430,(long)local_228,-0x18);
          sVar7 = local_548._M_string_length;
          strlen(local_228);
          std::__cxx11::string::_M_replace((ulong)&local_548,0,(char *)sVar7,(ulong)local_228);
          pbVar6 = local_568.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar22 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar21 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              pcVar3 = (pbVar21->_M_dataplus)._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != &pbVar21->field_2) {
                operator_delete(pcVar3);
              }
              pbVar21 = pbVar21 + 1;
            } while (pbVar21 != pbVar6);
            local_568.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar22;
          }
          split(&local_548,' ',&local_568);
          pbVar22 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          sVar16 = local_568.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
          if ((sVar16 != Name1_abi_cxx11_[(long)psVar23]._M_string_length) ||
             ((sVar16 != 0 &&
              (iVar9 = bcmp(local_568.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                            Name1_abi_cxx11_[(long)psVar23]._M_dataplus._M_p,sVar16), iVar9 != 0))))
          {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"bondParameter error, wrong AA type ",0x23);
            poVar15 = (ostream *)std::ostream::operator<<(&std::cout,(int)psVar23);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
            local_520.first._M_dataplus._M_p._0_1_ =
                 *local_568.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,(char *)&local_520,1);
            std::endl<char,std::char_traits<char>>(poVar15);
            goto LAB_00133d3d;
          }
          local_578 = 2;
          iVar9 = numAtom[(long)psVar23];
          local_550 = psVar23;
          if (0 < (long)iVar9) {
            pbVar22 = pbVar22 + 2;
            _Var17 = 5;
            lVar20 = 0;
            do {
              local_578 = _Var17 + ~_S_black;
              sVar16 = pbVar22->_M_string_length;
              if ((sVar16 != *(size_t *)(lVar18 + lVar20 * 4)) ||
                 ((sVar16 != 0 &&
                  (iVar10 = bcmp((pbVar22->_M_dataplus)._M_p,*(void **)(lVar18 + -8 + lVar20 * 4),
                                 sVar16), iVar10 != 0)))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"bondParamter error, wrong atom type ",0x24);
                poVar15 = (ostream *)std::ostream::operator<<(&std::cout,local_578);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,local_568.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start
                                             [(long)(int)local_578 + -1]._M_dataplus._M_p,
                                     local_568.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [(long)(int)local_578 + -1]._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,*(char **)(lVar18 + -8 + lVar20 * 4),
                                     *(long *)(lVar18 + lVar20 * 4));
                std::endl<char,std::char_traits<char>>(poVar15);
                goto LAB_00133d3d;
              }
              local_578 = _Var17 - _S_black;
              dVar25 = atof(pbVar22[1]._M_dataplus._M_p);
              puVar1 = (undefined1 *)((long)local_570 + lVar20);
              *(double *)((long)bond_length[0] + (long)puVar1) = dVar25;
              local_578 = _Var17;
              dVar25 = atof(pbVar22[2]._M_dataplus._M_p);
              *(double *)((long)bond_angle[0] + (long)puVar1) = dVar25 * 0.017453292519943278;
              pbVar22 = pbVar22 + 3;
              _Var17 = _Var17 + 3;
              lVar20 = lVar20 + 8;
            } while ((long)iVar9 * 8 != lVar20);
          }
          psVar23 = local_550 + 1;
          local_570 = local_570 + 0x1e;
          lVar18 = lVar18 + 0x3c0;
        } while ((long)psVar23 < (long)local_574);
      }
    }
    else if (CONCAT13(cStack_4ed,CONCAT12(cStack_4ee,CONCAT11(cStack_4ef,cStack_4f0))) == 0x657a69
             && CONCAT17(cStack_4f1,
                         CONCAT16(cStack_4f2,
                                  CONCAT15(cStack_4f3,
                                           CONCAT14(cStack_4f4,
                                                    CONCAT13(cStack_4f5,
                                                             CONCAT12(cStack_4f6,
                                                                      CONCAT11(cStack_4f7,local_4f8)
                                                                     )))))) == 0x5365756469736572) {
      if (0 < local_574) {
        lVar18 = 0;
        do {
          std::ios::widen((char)*(undefined8 *)(local_430[0] + -0x18) + (char)local_430);
          std::istream::getline((char *)local_430,(long)local_228,-0x18);
          sVar7 = local_548._M_string_length;
          strlen(local_228);
          std::__cxx11::string::_M_replace((ulong)&local_548,0,(char *)sVar7,(ulong)local_228);
          pbVar6 = local_568.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar22 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar21 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              pcVar3 = (pbVar21->_M_dataplus)._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != &pbVar21->field_2) {
                operator_delete(pcVar3);
              }
              pbVar21 = pbVar21 + 1;
            } while (pbVar21 != pbVar6);
            local_568.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar22;
          }
          split(&local_548,' ',&local_568);
          pbVar22 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar25 = atof(local_568.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
          size[lVar18] = dVar25;
          dVar25 = atof(pbVar22[4]._M_dataplus._M_p);
          sc_size[lVar18] = dVar25;
          lVar18 = lVar18 + 1;
        } while (lVar18 < local_574);
      }
    }
    else if (CONCAT17(cStack_4ec,
                      CONCAT16(cStack_4ed,
                               CONCAT15(cStack_4ee,
                                        CONCAT14(cStack_4ef,
                                                 CONCAT13(cStack_4f0,
                                                          CONCAT12(cStack_4f1,
                                                                   CONCAT11(cStack_4f2,cStack_4f3)))
                                                )))) == 0x656c676e416e6f &&
             CONCAT17(cStack_4f1,
                      CONCAT16(cStack_4f2,
                               CONCAT15(cStack_4f3,
                                        CONCAT14(cStack_4f4,
                                                 CONCAT13(cStack_4f5,
                                                          CONCAT12(cStack_4f6,
                                                                   CONCAT11(cStack_4f7,local_4f8))))
                                       ))) == 0x416e6f6973726f74) {
      if (0 < local_574) {
        lVar18 = 0x19b068;
        local_570 = torsion[0];
        psVar23 = (string *)0x0;
        do {
          std::ios::widen((char)*(undefined8 *)(local_430[0] + -0x18) + (char)local_430);
          std::istream::getline((char *)local_430,(long)local_228,-0x18);
          sVar7 = local_548._M_string_length;
          strlen(local_228);
          std::__cxx11::string::_M_replace((ulong)&local_548,0,(char *)sVar7,(ulong)local_228);
          pbVar6 = local_568.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar22 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar21 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              pcVar3 = (pbVar21->_M_dataplus)._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != &pbVar21->field_2) {
                operator_delete(pcVar3);
              }
              pbVar21 = pbVar21 + 1;
            } while (pbVar21 != pbVar6);
            local_568.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar22;
          }
          split(&local_548,' ',&local_568);
          pbVar22 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_578 = 2;
          iVar9 = numAtom[(long)psVar23];
          local_550 = psVar23;
          if (0 < (long)iVar9) {
            iVar10 = 2;
            lVar20 = 0;
            do {
              _Var17 = iVar10 + _S_black;
              sVar16 = pbVar22[iVar10]._M_string_length;
              local_578 = _Var17;
              if ((sVar16 != *(size_t *)(lVar18 + lVar20 * 4)) ||
                 ((sVar16 != 0 &&
                  (iVar11 = bcmp(pbVar22[iVar10]._M_dataplus._M_p,
                                 *(void **)(lVar18 + -8 + lVar20 * 4),sVar16), iVar11 != 0)))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"torsionAngle error, wrong atom type ",0x24);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     local_568.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [(long)(int)local_578 + -1]._M_dataplus._M_p,
                                     local_568.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [(long)(int)local_578 + -1]._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,*(char **)(lVar18 + -8 + lVar20 * 4),
                                     *(long *)(lVar18 + lVar20 * 4));
                std::endl<char,std::char_traits<char>>(poVar15);
                goto LAB_00133d3d;
              }
              pcVar4 = pbVar22[(int)_Var17]._M_dataplus._M_p;
              dVar25 = atof(pcVar4);
              if ((dVar25 != -1234.0) || (NAN(dVar25))) {
                local_578 = iVar10 + 2;
                dVar25 = atof(pcVar4);
                *(double *)((long)local_570 + lVar20) = dVar25 * 0.017453292519943278;
              }
              else {
                *(undefined8 *)((long)local_570 + lVar20) = 0xc093480000000000;
                local_578 = iVar10 + 2;
              }
              iVar10 = iVar10 + 2;
              lVar20 = lVar20 + 8;
            } while ((long)iVar9 * 8 != lVar20);
          }
          psVar23 = local_550 + 1;
          local_570 = local_570 + 0x1e;
          lVar18 = lVar18 + 0x3c0;
        } while ((long)psVar23 < (long)local_574);
      }
    }
    else {
      auVar26[0] = -(local_4f8 == 'f');
      auVar26[1] = -(cStack_4f7 == 'u');
      auVar26[2] = -(cStack_4f6 == 'n');
      auVar26[3] = -(cStack_4f5 == 'c');
      auVar26[4] = -(cStack_4f4 == 't');
      auVar26[5] = -(cStack_4f3 == 'i');
      auVar26[6] = -(cStack_4f2 == 'o');
      auVar26[7] = -(cStack_4f1 == 'n');
      auVar26[8] = -(cStack_4f0 == 'a');
      auVar26[9] = -(cStack_4ef == 'l');
      auVar26[10] = -(cStack_4ee == 'A');
      auVar26[0xb] = -(cStack_4ed == 't');
      auVar26[0xc] = -(cStack_4ec == 'o');
      auVar26[0xd] = -(cStack_4eb == 'm');
      auVar26[0xe] = -(cStack_4ea == 's');
      auVar26[0xf] = -(cStack_4e9 == '\0');
      if (((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar26[0xf] >> 7) << 0xf) == 0xffff) && (0 < local_574)) {
        local_570 = (double *)0x0;
        do {
          std::ios::widen((char)*(undefined8 *)(local_430[0] + -0x18) + (char)local_430);
          std::istream::getline((char *)local_430,(long)local_228,-0x18);
          sVar7 = local_548._M_string_length;
          strlen(local_228);
          std::__cxx11::string::_M_replace((ulong)&local_548,0,(char *)sVar7,(ulong)local_228);
          pbVar6 = local_568.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar22 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar21 = local_568.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_568.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              pcVar3 = (pbVar21->_M_dataplus)._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != &pbVar21->field_2) {
                operator_delete(pcVar3);
              }
              pbVar21 = pbVar21 + 1;
            } while (pbVar21 != pbVar6);
            local_568.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar22;
          }
          split(&local_548,' ',&local_568);
          pdVar19 = local_570;
          local_578 = 2;
          if (0x40 < (ulong)((long)local_568.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_568.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            this = (vector<int,std::allocator<int>> *)(funcAtom + (long)local_570);
            uVar24 = 2;
            lVar18 = 0x40;
            do {
              std::__cxx11::string::_M_assign((string *)&local_548);
              std::operator+(&local_520.first,&local_548,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&((local_568.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar18));
              std::__cxx11::string::operator=((string *)&local_548,(string *)&local_520);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_520.first._M_dataplus._M_p != &local_520.first.field_2) {
                operator_delete(local_520.first._M_dataplus._M_p);
              }
              iVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::find(&AtomMap_abi_cxx11_._M_t,&local_548);
              if ((_Rb_tree_header *)iVar14._M_node ==
                  &AtomMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"atom type error in reading functional atoms! ",
                           0x2d);
                poVar15 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_570);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)uVar24);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,local_548._M_dataplus._M_p,local_548._M_string_length);
                std::endl<char,std::char_traits<char>>(poVar15);
                goto LAB_00133d3d;
              }
              local_578 = iVar14._M_node[2]._M_color;
              __position._M_current =
                   funcAtom[(long)pdVar19].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  funcAtom[(long)pdVar19].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (this,__position,(int *)&local_578);
              }
              else {
                *__position._M_current = local_578;
                funcAtom[(long)pdVar19].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              uVar24 = uVar24 + 1;
              lVar18 = lVar18 + 0x20;
            } while (uVar24 < (ulong)((long)local_568.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_568.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          local_570 = (double *)((long)local_570 + 1);
        } while ((long)local_570 < (long)local_574);
      }
    }
    lVar18 = *(long *)(local_430[0] + -0x18);
    bVar2 = abStack_410[lVar18];
  } while( true );
}

Assistant:

void Residue::InitPar(char *parFile, string &dir) {
    int i, j, tmpInt, numLine;
    ifstream inFile;
    string tmpStr;
    char tempCh[200], tmpLine[500];
    vector<string> strVec;       // used in reading files
    SSMAP::iterator aaItr;
    SIMAP::iterator siItr;

    inFile.open(parFile, ios::in);
    if (!inFile.is_open()) {
        strcpy(tempCh, dir.c_str());
        strcat(tempCh, parFile);
        inFile.open(tempCh, ios::in);
        if (!inFile.is_open()) {
            cout << "cannot open parameter file " << tempCh << endl;
            exit(0);
        }
    }

    // read parameters
    inFile.clear();
    inFile.seekg(0, ios::beg);
    while (!inFile.eof()) {
        inFile.getline(tmpLine, 1000);
        sscanf(tmpLine, "%*s %s %d", tempCh, &numLine);
        if (strcmp(tempCh, "restype") == 0) { // read residue types
            int AtomIndex = 0;
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                Residue::numAtom[i] = (split(tmpStr, ' ', strVec) - 2) / 2;
                Name1[i] = strVec[0].c_str();
                tmpStr = Name1[i];
                if ((aaItr = AAMap.find(tmpStr)) == AAMap.end()) {
                    cout << "file reading error, wrong AA type " << tmpStr << endl;
                    exit(0);
                }
                else {
                    Name3[i] = aaItr->second;
                }
                tmpInt = 2;
                for (j = 0; j < Residue::numAtom[i]; ++j) {
                    Residue::cType[i][j] = strVec[tmpInt++];
                    Residue::vdwType[i][j] = atoi(strVec[tmpInt++].c_str());
                    tmpStr = Name1[i];
                    tmpStr += Residue::cType[i][j];
                    Residue::AtomMap.insert(SIMAP::value_type(tmpStr, j));
                    Residue::AtomIndexMap.insert(SIMAP::value_type(tmpStr, AtomIndex++));
                }
            }
        }
        else if (strcmp(tempCh, "atomDependency") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                if (strVec[1] != Residue::Name1[i]) {
                    cout << "atomDependency error, wrong AA type " << i << " " << strVec[1][0] << " " <<
                    Residue::Name1[i] << endl;
                    exit(0);
                }
                // read the atom dependency data for each atom
                tmpInt = 2;
                for (j = 0; j < Residue::numAtom[i]; ++j) {
                    if (strVec[tmpInt++] != Residue::cType[i][j]) {
                        cout << "atomDependency error, wrong atom type " << strVec[tmpInt] << " " <<
                        Residue::cType[i][j] << " " << i << endl;
                        exit(0);
                    }
                    // read the next three integers
                    Residue::prev_atom[i][j][0] = atoi(strVec[tmpInt++].c_str());
                    Residue::prev_atom[i][j][1] = atoi(strVec[tmpInt++].c_str());
                    Residue::prev_atom[i][j][2] = atoi(strVec[tmpInt++].c_str());
                }
            }
        }
        else if (strcmp(tempCh, "bondParameter") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                if (strVec[1] != Name1[i]) {
                    cout << "bondParameter error, wrong AA type " << i << " " << strVec[1][0] << endl;
                    exit(0);
                }
                // read the bond parameters
                tmpInt = 2;
                for (j = 0; j < numAtom[i]; ++j) {
                    if (strVec[tmpInt++] != cType[i][j]) {
                        cout << "bondParamter error, wrong atom type " << tmpInt << " " << strVec[tmpInt - 1] << " " <<
                        cType[i][j] << endl;
                        exit(0);
                    }
                    // read the next two double numbers
                    bond_length[i][j] = atof(strVec[tmpInt++].c_str());
                    bond_angle[i][j] = (PI / 180) * atof(strVec[tmpInt++].c_str());
                }
            }
        }
        else if (strcmp(tempCh, "residueSize") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                size[i] = atof(strVec[2].c_str());
                sc_size[i] = atof(strVec[4].c_str());
            }
        }
        else if (strcmp(tempCh, "torsionAngle") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                tmpInt = 2;
                for (j = 0; j < numAtom[i]; ++j) {
                    if (strVec[tmpInt++] != cType[i][j]) {
                        std::cout << "torsionAngle error, wrong atom type " << strVec[tmpInt - 1] << " " << cType[i][j] <<
                        endl;
                        exit(0);
                    }
                    if (atof(strVec[tmpInt].c_str()) == -1234) {
                        torsion[i][j] = -1234;
                        tmpInt++;
                    }
                    else
                        torsion[i][j] = (PI / 180) * atof(strVec[tmpInt++].c_str());
                }
            }
        }
        else if (strcmp(tempCh, "functionalAtoms") == 0) {
            for (i = 0; i < numLine; ++i) {
                inFile.getline(tmpLine, 1000);
                tmpStr = tmpLine;
                strVec.clear();
                split(tmpStr, ' ', strVec);
                tmpInt = 2;
                for (j = 2; j < strVec.size(); ++j) {
                    tmpStr = strVec[0];
                    tmpStr = tmpStr + strVec[j];
                    siItr = AtomMap.find(tmpStr);
                    if (siItr == AtomMap.end()) {
                        cout << "atom type error in reading functional atoms! " << i << " " << j << " " << tmpStr <<
                        endl;
                        exit(0);
                    }
                    tmpInt = siItr->second;
                    funcAtom[i].push_back(tmpInt);
                }
            }
        }
        else {
            continue;
        }
    }

    // set backbone size
    bb_size = 1.93;
    // initialize functional group atoms

}